

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  Index *pIVar1;
  bool bVar2;
  byte bVar3;
  int p3;
  Vdbe *p;
  byte bVar4;
  ushort uVar5;
  Index **ppIVar6;
  
  p = sqlite3GetVdbe(pParse);
  bVar4 = (useSeekResult != 0) << 4;
  bVar2 = false;
  ppIVar6 = &pTab->pIndex;
  while (pIVar1 = *ppIVar6, pIVar1 != (Index *)0x0) {
    if (*aRegIdx != 0) {
      if (pIVar1->pPartIdxWhere != (Expr *)0x0) {
        sqlite3VdbeAddOp2(p,0x4b,*aRegIdx,p->nOp + 2);
      }
      uVar5 = (ushort)bVar4;
      if ((pIVar1->field_0x63 & 3) == 2) {
        uVar5 = (ushort)(byte)(((byte)update_flags & 2 | bVar4) + 1);
        if ((pTab->tabFlags & 0x20) == 0) {
          uVar5 = (ushort)bVar4;
        }
      }
      sqlite3VdbeAddOp4Int
                (p,0x7e,iIdxCur,*aRegIdx,*aRegIdx + 1,
                 (uint)(&pIVar1->nKeyCol)[(pIVar1->field_0x63 & 8) == 0]);
      bVar2 = true;
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = uVar5;
      }
    }
    iIdxCur = iIdxCur + 1;
    aRegIdx = aRegIdx + 1;
    ppIVar6 = &pIVar1->pNext;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    p3 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(p,99,regNewData + 1,(int)pTab->nCol,p3);
    if (!bVar2) {
      sqlite3TableAffinity(p,pTab,0);
      sqlite3ExprCacheRemove(pParse,regNewData + 1,(int)pTab->nCol);
    }
    bVar4 = 0x21;
    if (update_flags != 0) {
      bVar4 = (byte)update_flags | 1;
    }
    bVar3 = 0;
    if (pParse->nested == '\0') {
      bVar3 = bVar4;
    }
    bVar4 = bVar3 | 8;
    if (appendBias == 0) {
      bVar4 = bVar3;
    }
    bVar3 = bVar4 | 0x10;
    if (useSeekResult == 0) {
      bVar3 = bVar4;
    }
    sqlite3VdbeAddOp3(p,0x74,iDataCur,p3,regNewData);
    if (pParse->nested == '\0') {
      sqlite3VdbeAppendP4(p,pTab,-6);
    }
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)bVar3;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int regData;        /* Content registers (after the rowid) */
  int regRec;         /* Register holding assembled record for the table */
  int i;              /* Loop counter */
  u8 bAffinityDone = 0; /* True if OP_Affinity has been run already */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    if( aRegIdx[i]==0 ) continue;
    bAffinityDone = 1;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      assert( pParse->nested==0 );
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      if( update_flags==0 ){
        sqlite3VdbeAddOp4(v, OP_InsertInt, 
            iIdxCur+i, aRegIdx[i], 0, (char*)pTab, P4_TABLE
        );
        sqlite3VdbeChangeP5(v, OPFLAG_ISNOOP);
      }
#endif
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  regData = regNewData + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3SetMakeRecordP5(v, pTab);
  if( !bAffinityDone ){
    sqlite3TableAffinity(v, pTab, 0);
    sqlite3ExprCacheAffinityChange(pParse, regData, pTab->nCol);
  }
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, regRec, regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}